

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_load(NJDNode *node,char *str)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  NJDNode *node2;
  int iVar5;
  int iVar6;
  int index_acc;
  ulong local_1860;
  int index_pron;
  int index_read;
  int index_orig;
  ulong local_1848;
  int index;
  char buff [1024];
  char buff_acc [1024];
  char buff_pron [1024];
  char buff_read [1024];
  char buff_orig [1024];
  char buff_string [1024];
  
  index = 0;
  get_token_from_string(str,&index,buff_string,',');
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_pos(node,buff);
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_pos_group1(node,buff);
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_pos_group2(node,buff);
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_pos_group3(node,buff);
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_ctype(node,buff);
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_cform(node,buff);
  get_token_from_string(str,&index,buff_orig,',');
  get_token_from_string(str,&index,buff_read,',');
  get_token_from_string(str,&index,buff_pron,',');
  get_token_from_string(str,&index,buff_acc,',');
  get_token_from_string(str,&index,buff,',');
  NJDNode_set_chain_rule(node,buff);
  get_token_from_string(str,&index,buff,',');
  if (buff._0_2_ == 0x31) {
    iVar5 = 1;
  }
  else {
    if (buff._0_2_ != 0x30) goto LAB_0013ec5d;
    iVar5 = 0;
  }
  node->chain_flag = iVar5;
LAB_0013ec5d:
  pcVar2 = strchr(buff_acc,0x2a);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = buff_acc;
    pcVar3 = strchr(pcVar2,0x2f);
    if (pcVar3 != (char *)0x0) {
      iVar5 = 0;
      do {
        if (*pcVar2 == '/') {
          iVar5 = iVar5 + 1;
        }
        else if (*pcVar2 == '\0') {
          if (iVar5 == 1) {
            NJDNode_set_string(node,buff_string);
            NJDNode_set_orig(node,buff_orig);
            NJDNode_set_read(node,buff_read);
            NJDNode_set_pron(node,buff_pron);
            index_acc = 0;
            get_token_from_string(buff_acc,&index_acc,buff,'/');
            if (buff[0] == '\0') {
              fwrite("WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n",0x38,1,_stderr);
              iVar5 = 0;
            }
            else {
              iVar5 = atoi(buff);
            }
            NJDNode_set_acc(node,iVar5);
            get_token_from_string(buff_acc,&index_acc,buff,':');
            if (buff[0] == '\0') {
              fwrite("WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n",0x3b,1,_stderr);
              iVar5 = 0;
            }
            else {
              iVar5 = atoi(buff);
            }
            NJDNode_set_mora_size(node,iVar5);
            return;
          }
          index_orig = 0;
          index_read = 0;
          index_pron = 0;
          index_acc = 0;
          local_1860 = 0;
          iVar6 = 0;
          if (0 < iVar5) {
            iVar6 = iVar5;
          }
          local_1848 = (ulong)(uint)-iVar6;
          node2 = (NJDNode *)0x0;
          for (iVar6 = 1; (int)local_1848 + iVar6 != 1; iVar6 = iVar6 + 1) {
            if (iVar6 != 1) {
              node = (NJDNode *)calloc(1,0x78);
              node->string = (char *)0x0;
              node->pos = (char *)0x0;
              node->pos_group1 = (char *)0x0;
              node->pos_group2 = (char *)0x0;
              node->pos_group3 = (char *)0x0;
              node->ctype = (char *)0x0;
              node->cform = (char *)0x0;
              node->orig = (char *)0x0;
              node->read = (char *)0x0;
              node->pron = (char *)0x0;
              node->acc = 0;
              node->mora_size = 0;
              node->chain_rule = (char *)0x0;
              node->chain_flag = -1;
              node->prev = (_NJDNode *)0x0;
              node->next = (_NJDNode *)0x0;
              NJDNode_copy(node,node2);
              node->chain_flag = 0;
              node->prev = node2;
              node2->next = node;
            }
            node2 = node;
            get_token_from_string(buff_orig,&index_orig,buff,':');
            NJDNode_set_orig(node2,buff);
            if (iVar6 < iVar5) {
              NJDNode_set_string(node2,buff);
              sVar4 = strlen(buff);
              local_1860 = (ulong)(uint)((int)local_1860 + (int)sVar4);
            }
            else {
              NJDNode_set_string(node2,buff_string + (int)local_1860);
            }
            get_token_from_string(buff_read,&index_read,buff,':');
            NJDNode_set_read(node2,buff);
            get_token_from_string(buff_pron,&index_pron,buff,':');
            NJDNode_set_pron(node2,buff);
            get_token_from_string(buff_acc,&index_acc,buff,'/');
            if (buff[0] == '\0') {
              fwrite("WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n",0x38,1,_stderr);
              iVar1 = 0;
            }
            else {
              iVar1 = atoi(buff);
            }
            NJDNode_set_acc(node2,iVar1);
            get_token_from_string(buff_acc,&index_acc,buff,':');
            if (buff[0] == '\0') {
              fwrite("WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n",0x3b,1,_stderr);
              iVar1 = 0;
            }
            else {
              iVar1 = atoi(buff);
            }
            NJDNode_set_mora_size(node2,iVar1);
            node = node2;
          }
          return;
        }
        pcVar2 = pcVar2 + 1;
      } while( true );
    }
  }
  NJDNode_set_string(node,buff_string);
  NJDNode_set_orig(node,buff_orig);
  NJDNode_set_read(node,buff_read);
  NJDNode_set_pron(node,buff_pron);
  node->acc = 0;
  node->mora_size = 0;
  return;
}

Assistant:

void NJDNode_load(NJDNode * node, const char *str)
{
   int i, j;
   int index = 0;
   char buff[MAXBUFLEN];
   char buff_string[MAXBUFLEN];
   char buff_orig[MAXBUFLEN];
   char buff_read[MAXBUFLEN];
   char buff_pron[MAXBUFLEN];
   char buff_acc[MAXBUFLEN];
   int count;
   int index_string;
   int index_orig;
   int index_read;
   int index_pron;
   int index_acc;
   NJDNode *prev = NULL;

   /* load */
   get_token_from_string(str, &index, buff_string, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group1(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group2(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group3(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_ctype(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_cform(node, buff);
   get_token_from_string(str, &index, buff_orig, ',');
   get_token_from_string(str, &index, buff_read, ',');
   get_token_from_string(str, &index, buff_pron, ',');
   get_token_from_string(str, &index, buff_acc, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_chain_rule(node, buff);
   get_token_from_string(str, &index, buff, ',');
   if (strcmp(buff, "1") == 0)
      NJDNode_set_chain_flag(node, 1);
   else if (strcmp(buff, "0") == 0)
      NJDNode_set_chain_flag(node, 0);

   /* for symbol */
   if (strstr(buff_acc, "*") != NULL || strstr(buff_acc, "/") == NULL) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      NJDNode_set_acc(node, 0);
      NJDNode_set_mora_size(node, 0);
      return;
   }

   /* count chained word */
   for (i = 0, count = 0; buff_acc[i] != '\0'; i++)
      if (buff_acc[i] == '/')
         count++;

   /* for single word */
   if (count == 1) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      index_acc = 0;
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      return;
   }

   /* parse chained word */
   index_string = 0;
   index_orig = 0;
   index_read = 0;
   index_pron = 0;
   index_acc = 0;
   for (i = 0; i < count; i++) {
      if (i > 0) {
         node = (NJDNode *) calloc(1, sizeof(NJDNode));
         NJDNode_initialize(node);
         NJDNode_copy(node, prev);
         NJDNode_set_chain_flag(node, 0);
         node->prev = prev;
         prev->next = node;
      }
      /* orig */
      get_token_from_string(buff_orig, &index_orig, buff, ':');
      NJDNode_set_orig(node, buff);
      /* string */
      if (i + 1 < count) {
         NJDNode_set_string(node, buff);
         index_string += strlen(buff);
      } else {
         NJDNode_set_string(node, &buff_string[index_string]);
      }
      /* read */
      get_token_from_string(buff_read, &index_read, buff, ':');
      NJDNode_set_read(node, buff);
      /* pron */
      get_token_from_string(buff_pron, &index_pron, buff, ':');
      NJDNode_set_pron(node, buff);
      /* acc */
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      /* mora size */
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      prev = node;
   }
}